

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O1

xmlParserInputBufferPtr xmlParserInputBufferCreateFile(FILE *file,xmlCharEncoding enc)

{
  xmlParserInputBufferPtr pxVar1;
  
  if (file != (FILE *)0x0) {
    pxVar1 = xmlAllocParserInputBuffer(enc);
    if (pxVar1 != (xmlParserInputBufferPtr)0x0) {
      pxVar1->context = file;
      pxVar1->readcallback = xmlFileRead;
      pxVar1->closecallback = (xmlInputCloseCallback)0x0;
    }
    return pxVar1;
  }
  return (xmlParserInputBufferPtr)0x0;
}

Assistant:

xmlParserInputBufferPtr
xmlParserInputBufferCreateFile(FILE *file, xmlCharEncoding enc) {
    xmlParserInputBufferPtr ret;

    if (file == NULL) return(NULL);

    ret = xmlAllocParserInputBuffer(enc);
    if (ret != NULL) {
        ret->context = file;
	ret->readcallback = xmlFileRead;
	ret->closecallback = NULL;
    }

    return(ret);
}